

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

Marray<int,_std::allocator<unsigned_long>_> * __thiscall
andres::Marray<int,_std::allocator<unsigned_long>_>::operator=
          (Marray<int,_std::allocator<unsigned_long>_> *this,
          Marray<int,_std::allocator<unsigned_long>_> *in)

{
  pointer __dest;
  pointer __src;
  size_t sVar1;
  size_t sVar2;
  int *piVar3;
  Marray<int,_std::allocator<unsigned_long>_> *in_local;
  Marray<int,_std::allocator<unsigned_long>_> *this_local;
  
  testInvariant(this);
  testInvariant(in);
  if (this != in) {
    if ((in->super_View<int,_false,_std::allocator<unsigned_long>_>).data_ == (pointer)0x0) {
      piVar3 = (this->super_View<int,_false,_std::allocator<unsigned_long>_>).data_;
      sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::size
                        (&this->super_View<int,_false,_std::allocator<unsigned_long>_>);
      __gnu_cxx::new_allocator<int>::deallocate
                ((new_allocator<int> *)&this->field_0x40,piVar3,sVar1);
      (this->super_View<int,_false,_std::allocator<unsigned_long>_>).data_ = (pointer)0x0;
    }
    else {
      sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::size
                        (&this->super_View<int,_false,_std::allocator<unsigned_long>_>);
      sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::size
                        (&in->super_View<int,_false,_std::allocator<unsigned_long>_>);
      if (sVar1 != sVar2) {
        piVar3 = (this->super_View<int,_false,_std::allocator<unsigned_long>_>).data_;
        sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::size
                          (&this->super_View<int,_false,_std::allocator<unsigned_long>_>);
        __gnu_cxx::new_allocator<int>::deallocate
                  ((new_allocator<int> *)&this->field_0x40,piVar3,sVar1);
        sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::size
                          (&in->super_View<int,_false,_std::allocator<unsigned_long>_>);
        piVar3 = __gnu_cxx::new_allocator<int>::allocate
                           ((new_allocator<int> *)&this->field_0x40,sVar1,(void *)0x0);
        (this->super_View<int,_false,_std::allocator<unsigned_long>_>).data_ = piVar3;
      }
      __dest = (this->super_View<int,_false,_std::allocator<unsigned_long>_>).data_;
      __src = (in->super_View<int,_false,_std::allocator<unsigned_long>_>).data_;
      sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::size
                        (&in->super_View<int,_false,_std::allocator<unsigned_long>_>);
      memcpy(__dest,__src,sVar1 << 2);
    }
    marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
              (&(this->super_View<int,_false,_std::allocator<unsigned_long>_>).geometry_,
               &(in->super_View<int,_false,_std::allocator<unsigned_long>_>).geometry_);
  }
  testInvariant(this);
  return this;
}

Assistant:

Marray<T, A>&
Marray<T, A>::operator=
(
    const Marray<T, A>& in
)
{
    testInvariant();
    if(!MARRAY_NO_ARG_TEST) {
        in.testInvariant();
    }
    if(this != &in) { // no self-assignment
        // copy data
        if(in.data_ == 0) { // un-initialized
            // free
            dataAllocator_.deallocate(this->data_, this->size());
            this->data_ = 0;
        }
        else {
            if(this->size() != in.size()) {
                // re-alloc
                dataAllocator_.deallocate(this->data_, this->size());
                this->data_ = dataAllocator_.allocate(in.size());
            }
            // copy data
            memcpy(this->data_, in.data_, in.size() * sizeof(T));
        }
        this->geometry_ = in.geometry_;
    }
    testInvariant();
    return *this;
}